

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

int slurp_central_directory(archive_read *a,_7zip *zip,_7z_header_info *header)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  bool bVar4;
  int local_58;
  int r;
  int check_header_crc;
  ssize_t bytes_avail;
  uchar *puStack_40;
  uint32_t next_header_crc;
  uint64_t next_header_size;
  uint64_t next_header_offset;
  uchar *p;
  _7z_header_info *header_local;
  _7zip *zip_local;
  archive_read *a_local;
  
  p = (uchar *)header;
  header_local = (_7z_header_info *)zip;
  zip_local = (_7zip *)a;
  next_header_offset = (uint64_t)__archive_read_ahead(a,0x20,(ssize_t *)&r);
  if ((int *)next_header_offset == (int *)0x0) {
    return -0x1e;
  }
  if ((((char)*(int *)next_header_offset == 'M') && (*(char *)(next_header_offset + 1) == 'Z')) ||
     (*(int *)next_header_offset == 0x464c457f)) {
    iVar1 = skip_sfx((archive_read *)zip_local,_r);
    if (iVar1 < -0x14) {
      return iVar1;
    }
    next_header_offset =
         (uint64_t)__archive_read_ahead((archive_read *)zip_local,0x20,(ssize_t *)&r);
    if ((void *)next_header_offset == (void *)0x0) {
      return -0x1e;
    }
  }
  header_local[3].emptyFileBools = header_local[3].emptyFileBools + 0x20;
  iVar1 = memcmp((void *)next_header_offset,anon_var_dwarf_edd6b,6);
  if (iVar1 == 0) {
    cm_zlib_crc32(0,(uchar *)(next_header_offset + 0xc),0x14);
    archive_le32dec((void *)(next_header_offset + 8));
    next_header_size = archive_le64dec((void *)(next_header_offset + 0xc));
    puStack_40 = (uchar *)archive_le64dec((void *)(next_header_offset + 0x14));
    bytes_avail._4_4_ = archive_le32dec((void *)(next_header_offset + 0x1c));
    if (puStack_40 == (uchar *)0x0) {
      a_local._4_4_ = 1;
    }
    else if ((long)next_header_size < 0) {
      archive_set_error((archive *)zip_local,-1,"Malformed 7-Zip archive");
      a_local._4_4_ = -0x1e;
    }
    else {
      __archive_read_consume((archive_read *)zip_local,0x20);
      if (next_header_size != 0) {
        if (_r < (long)next_header_size) {
          iVar2 = __archive_read_seek((archive_read *)zip_local,
                                      (int64_t)(header_local[3].emptyFileBools + next_header_size),0
                                     );
          if (iVar2 < 0) {
            return -0x1e;
          }
        }
        else {
          __archive_read_consume((archive_read *)zip_local,next_header_size);
        }
      }
      header_local[6].emptyStreamBools = (uchar *)next_header_size;
      header_local[3].emptyStreamBools = (uchar *)next_header_size;
      header_local[2].attrBools = puStack_40;
      header_local[3].dataIndex = 0;
      *(undefined4 *)((long)&header_local[2].antiBools + 4) = 0;
      *(undefined4 *)&header_local[2].antiBools = 1;
      *(undefined4 *)&header_local[0x206].attrBools = 0;
      bVar4 = true;
      next_header_offset = (uint64_t)header_bytes((archive_read *)zip_local,1);
      if ((byte *)next_header_offset == (byte *)0x0) {
        archive_set_error((archive *)zip_local,0x54,"Truncated 7-Zip file body");
        a_local._4_4_ = -0x1e;
      }
      else {
        if (*(byte *)next_header_offset != 1) {
          if (*(byte *)next_header_offset != 0x17) {
            archive_set_error((archive *)zip_local,-1,"Unexpected Property ID = %X",
                              (ulong)*(byte *)next_header_offset);
            return -0x1e;
          }
          local_58 = decode_encoded_header_info
                               ((archive_read *)zip_local,(_7z_stream_info *)header_local);
          if ((local_58 == 0) && (header_local[3].dataIndex != (ulong)bytes_avail._4_4_)) {
            archive_set_error((archive *)zip_local,-1,"Damaged 7-Zip archive");
            local_58 = -1;
          }
          if (local_58 == 0) {
            bVar4 = header_local[1].emptyFileBools[0x48] != '\0';
            if (bVar4) {
              bytes_avail._4_4_ = *(uint32_t *)(header_local[1].emptyFileBools + 0x4c);
            }
            if (header_local[7].emptyStreamBools != (uchar *)0x0) {
              read_consume((archive_read *)zip_local);
            }
            local_58 = setup_decode_folder((archive_read *)zip_local,
                                           (_7z_folder *)header_local[1].emptyFileBools,1);
            if (local_58 == 0) {
              header_local[2].attrBools = header_local[6].antiBools;
              local_58 = seek_pack((archive_read *)zip_local);
            }
          }
          free_StreamsInfo((_7z_stream_info *)header_local);
          memset(header_local,0,0x68);
          if (local_58 < 0) {
            return -0x1e;
          }
          *(undefined4 *)((long)&header_local[2].antiBools + 4) = 1;
          header_local[3].dataIndex = 0;
        }
        piVar3 = __errno_location();
        *piVar3 = 0;
        iVar1 = read_Header((archive_read *)zip_local,(_7z_header_info *)p,
                            *(int *)((long)&header_local[2].antiBools + 4));
        if (iVar1 < 0) {
          piVar3 = __errno_location();
          if (*piVar3 == 0xc) {
            archive_set_error((archive *)zip_local,-1,"Couldn\'t allocate memory");
          }
          else {
            archive_set_error((archive *)zip_local,-1,"Damaged 7-Zip archive");
          }
          a_local._4_4_ = -0x1e;
        }
        else {
          next_header_offset = (uint64_t)header_bytes((archive_read *)zip_local,1);
          if (((uchar *)next_header_offset == (uchar *)0x0) ||
             (*(uchar *)next_header_offset != '\0')) {
            archive_set_error((archive *)zip_local,-1,"Malformed 7-Zip archive");
            a_local._4_4_ = -0x1e;
          }
          else if ((bVar4) && (header_local[3].dataIndex != (ulong)bytes_avail._4_4_)) {
            archive_set_error((archive *)zip_local,-1,"Malformed 7-Zip archive");
            a_local._4_4_ = -0x1e;
          }
          else {
            *(undefined4 *)((long)&header_local[6].attrBools + 4) = 0;
            *(undefined4 *)&header_local[6].attrBools = 0;
            header_local[6].antiBools = (uchar *)0x0;
            header_local[6].dataIndex = 0;
            header_local[7].emptyStreamBools = (uchar *)0x0;
            *(undefined4 *)&header_local[2].antiBools = 0;
            a_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    archive_set_error((archive *)zip_local,-1,"Not 7-Zip archive file");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
slurp_central_directory(struct archive_read *a, struct archive_entry* entry,
    struct zip *zip)
{
	ssize_t i;
	unsigned found;
	int64_t correction;
	ssize_t bytes_avail;
	const char *p;

	/*
	 * Find the start of the central directory.  The end-of-CD
	 * record has our starting point, but there are lots of
	 * Zip archives which have had other data prepended to the
	 * file, which makes the recorded offsets all too small.
	 * So we search forward from the specified offset until we
	 * find the real start of the central directory.  Then we
	 * know the correction we need to apply to account for leading
	 * padding.
	 */
	if (__archive_read_seek(a, zip->central_directory_offset_adjusted, SEEK_SET)
		< 0)
		return ARCHIVE_FATAL;

	found = 0;
	while (!found) {
		if ((p = __archive_read_ahead(a, 20, &bytes_avail)) == NULL)
			return ARCHIVE_FATAL;
		for (found = 0, i = 0; !found && i < bytes_avail - 4;) {
			switch (p[i + 3]) {
			case 'P': i += 3; break;
			case 'K': i += 2; break;
			case 001: i += 1; break;
			case 002:
				if (memcmp(p + i, "PK\001\002", 4) == 0) {
					p += i;
					found = 1;
				} else
					i += 4;
				break;
			case 005: i += 1; break;
			case 006:
				if (memcmp(p + i, "PK\005\006", 4) == 0) {
					p += i;
					found = 1;
				} else if (memcmp(p + i, "PK\006\006", 4) == 0) {
					p += i;
					found = 1;
				} else
					i += 1;
				break;
			default: i += 4; break;
			}
		}
		__archive_read_consume(a, i);
	}
	correction = archive_filter_bytes(&a->archive, 0)
			- zip->central_directory_offset;

	__archive_rb_tree_init(&zip->tree, &rb_ops);
	__archive_rb_tree_init(&zip->tree_rsrc, &rb_rsrc_ops);

	zip->central_directory_entries_total = 0;
	while (1) {
		struct zip_entry *zip_entry;
		size_t filename_length, extra_length, comment_length;
		uint32_t external_attributes;
		const char *name, *r;

		if ((p = __archive_read_ahead(a, 4, NULL)) == NULL)
			return ARCHIVE_FATAL;
		if (memcmp(p, "PK\006\006", 4) == 0
		    || memcmp(p, "PK\005\006", 4) == 0) {
			break;
		} else if (memcmp(p, "PK\001\002", 4) != 0) {
			archive_set_error(&a->archive,
			    -1, "Invalid central directory signature");
			return ARCHIVE_FATAL;
		}
		if ((p = __archive_read_ahead(a, 46, NULL)) == NULL)
			return ARCHIVE_FATAL;

		zip_entry = calloc(1, sizeof(struct zip_entry));
		if (zip_entry == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip entry");
			return ARCHIVE_FATAL;
		}
		zip_entry->next = zip->zip_entries;
		zip_entry->flags |= LA_FROM_CENTRAL_DIRECTORY;
		zip->zip_entries = zip_entry;
		zip->central_directory_entries_total++;

		/* version = p[4]; */
		zip_entry->system = p[5];
		/* version_required = archive_le16dec(p + 6); */
		zip_entry->zip_flags = archive_le16dec(p + 8);
		if (zip_entry->zip_flags
		      & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)){
			zip->has_encrypted_entries = 1;
		}
		zip_entry->compression = (char)archive_le16dec(p + 10);
		zip_entry->mtime = zip_time(p + 12);
		zip_entry->crc32 = archive_le32dec(p + 16);
		if (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
			zip_entry->decdat = p[13];
		else
			zip_entry->decdat = p[19];
		zip_entry->compressed_size = archive_le32dec(p + 20);
		zip_entry->uncompressed_size = archive_le32dec(p + 24);
		filename_length = archive_le16dec(p + 28);
		extra_length = archive_le16dec(p + 30);
		comment_length = archive_le16dec(p + 32);
		/* disk_start = archive_le16dec(p + 34);
		 *   Better be zero.
		 * internal_attributes = archive_le16dec(p + 36);
		 *   text bit */
		external_attributes = archive_le32dec(p + 38);
		zip_entry->local_header_offset =
		    archive_le32dec(p + 42) + correction;

		/* If we can't guess the mode, leave it zero here;
		   when we read the local file header we might get
		   more information. */
		if (zip_entry->system == 3) {
			zip_entry->mode = external_attributes >> 16;
		} else if (zip_entry->system == 0) {
			// Interpret MSDOS directory bit
			if (0x10 == (external_attributes & 0x10)) {
				zip_entry->mode = AE_IFDIR | 0775;
			} else {
				zip_entry->mode = AE_IFREG | 0664;
			}
			if (0x01 == (external_attributes & 0x01)) {
				// Read-only bit; strip write permissions
				zip_entry->mode &= 0555;
			}
		} else {
			zip_entry->mode = 0;
		}

		/* We're done with the regular data; get the filename and
		 * extra data. */
		__archive_read_consume(a, 46);
		p = __archive_read_ahead(a, filename_length + extra_length,
			NULL);
		if (p == NULL) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file header");
			return ARCHIVE_FATAL;
		}
		if (ARCHIVE_OK != process_extra(a, entry, p + filename_length,
		    extra_length, zip_entry)) {
			return ARCHIVE_FATAL;
		}

		/*
		 * Mac resource fork files are stored under the
		 * "__MACOSX/" directory, so we should check if
		 * it is.
		 */
		if (!zip->process_mac_extensions) {
			/* Treat every entry as a regular entry. */
			__archive_rb_tree_insert_node(&zip->tree,
			    &zip_entry->node);
		} else {
			name = p;
			r = rsrc_basename(name, filename_length);
			if (filename_length >= 9 &&
			    strncmp("__MACOSX/", name, 9) == 0) {
				/* If this file is not a resource fork nor
				 * a directory. We should treat it as a non
				 * resource fork file to expose it. */
				if (name[filename_length-1] != '/' &&
				    (r - name < 3 || r[0] != '.' ||
				     r[1] != '_')) {
					__archive_rb_tree_insert_node(
					    &zip->tree, &zip_entry->node);
					/* Expose its parent directories. */
					expose_parent_dirs(zip, name,
					    filename_length);
				} else {
					/* This file is a resource fork file or
					 * a directory. */
					archive_strncpy(&(zip_entry->rsrcname),
					     name, filename_length);
					__archive_rb_tree_insert_node(
					    &zip->tree_rsrc, &zip_entry->node);
				}
			} else {
				/* Generate resource fork name to find its
				 * resource file at zip->tree_rsrc. */
				archive_strcpy(&(zip_entry->rsrcname),
				    "__MACOSX/");
				archive_strncat(&(zip_entry->rsrcname),
				    name, r - name);
				archive_strcat(&(zip_entry->rsrcname), "._");
				archive_strncat(&(zip_entry->rsrcname),
				    name + (r - name),
				    filename_length - (r - name));
				/* Register an entry to RB tree to sort it by
				 * file offset. */
				__archive_rb_tree_insert_node(&zip->tree,
				    &zip_entry->node);
			}
		}

		/* Skip the comment too ... */
		__archive_read_consume(a,
		    filename_length + extra_length + comment_length);
	}

	return ARCHIVE_OK;
}